

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O1

bool DynamicProfileStorage::ImportFile(char16 *filename,bool allowNonExistingFile)

{
  DynamicProfileStorageReaderWriter *this;
  code *pcVar1;
  char16 *obj;
  bool bVar2;
  bool bVar3;
  undefined4 *puVar4;
  char *pcVar5;
  char *t;
  uint uVar6;
  char16 *local_268;
  char16 error_string [256];
  DynamicProfileStorageReaderWriter reader;
  uint local_48;
  uint local_44;
  DWORD magic;
  DWORD version;
  DWORD recordLen;
  errno_t e;
  DWORD recordCount;
  DWORD len;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x1f0,"(enabled)","enabled");
    if (!bVar2) goto LAB_0097d450;
    *puVar4 = 0;
  }
  error_string[0xfc] = L'\0';
  error_string[0xfd] = L'\0';
  error_string[0xfe] = L'\0';
  error_string[0xff] = L'\0';
  bVar2 = DynamicProfileStorageReaderWriter::Init
                    ((DynamicProfileStorageReaderWriter *)(error_string + 0xfc),filename,L"rb",false
                     ,(errno_t *)&version);
  if (bVar2) {
    bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                      ((DynamicProfileStorageReaderWriter *)(error_string + 0xfc),&local_48,1);
    if (bVar2) {
      bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                        ((DynamicProfileStorageReaderWriter *)(error_string + 0xfc),&local_44,1);
      if (bVar2) {
        bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>
                          ((DynamicProfileStorageReaderWriter *)(error_string + 0xfc),&recordLen,1);
        if (bVar2) {
          if (local_48 == 0x132b5ae) {
            if (local_44 == 2) {
              if (recordLen != 0) {
                uVar6 = 0;
                this = (DynamicProfileStorageReaderWriter *)(error_string + 0xfc);
                do {
                  bVar2 = DynamicProfileStorageReaderWriter::ReadUtf8String
                                    (this,&local_268,(DWORD *)&e);
                  if (!bVar2) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                    *puVar4 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                       ,0x22b,"(false)","false");
LAB_0097d441:
                    if (bVar2 == false) goto LAB_0097d450;
                    *puVar4 = 0;
                    goto LAB_0097d2d1;
                  }
                  bVar2 = DynamicProfileStorageReaderWriter::ReadArray<unsigned_int>(this,&magic,1);
                  if (!bVar2) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                    *puVar4 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                       ,0x232,"(false)","false");
                    goto LAB_0097d441;
                  }
                  pcVar5 = AllocRecord(magic);
                  if (pcVar5 == (char *)0x0) {
                    Output::Print(L"ERROR: DynamicProfileStorage: Out of memory importing \'%s\'\n",
                                  filename);
                    Output::Flush();
                    Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
                              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,
                               (ulong)(e + 1),local_268);
                    goto LAB_0097d2d1;
                  }
                  t = GetRecordBuffer(pcVar5);
                  bVar2 = DynamicProfileStorageReaderWriter::ReadArray<char>(this,t,(ulong)magic);
                  obj = local_268;
                  if (!bVar2) {
                    Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
                              ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,
                               (ulong)(e + 1),local_268);
                    DeleteRecord(pcVar5);
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                    *puVar4 = 1;
                    bVar2 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                       ,0x243,"(false)","false");
                    goto LAB_0097d441;
                  }
                  SaveRecord(local_268,pcVar5);
                  Memory::DeleteArray<Memory::NoCheckHeapAllocator,char16_t>
                            ((AllocatorType *)&Memory::NoCheckHeapAllocator::Instance,(ulong)(e + 1)
                             ,obj);
                  uVar6 = uVar6 + 1;
                } while (uVar6 < recordLen);
              }
              bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,DynamicProfileStoragePhase);
              if (bVar2) {
                Output::Print(L"TRACE: DynamicProfileStorage: Imported file: \'%s\'\n",filename);
                Output::Flush();
              }
              bVar2 = true;
              if (recordLen != infoMap.count - infoMap.freeCount) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
                *puVar4 = 1;
                bVar3 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                                   ,0x253,"(recordCount == (uint)infoMap.Count())",
                                   "failed to read all the records");
                if (!bVar3) {
LAB_0097d450:
                  pcVar1 = (code *)invalidInstructionException();
                  (*pcVar1)();
                }
                *puVar4 = 0;
              }
              goto LAB_0097d2d4;
            }
            bVar2 = true;
            if (allowNonExistingFile) goto LAB_0097d2d4;
            Output::Print(L"ERROR: DynamicProfileStorage: \'%s\' has format version %d; version %d expected"
                          ,filename,(ulong)local_44,2);
          }
          else {
            Output::Print(L"ERROR: DynamicProfileStorage: \'%s\' is not a dynamic profile data file"
                          ,filename);
          }
          Output::Flush();
        }
      }
    }
  }
  else {
    bVar2 = true;
    if (allowNonExistingFile) goto LAB_0097d2d4;
    if (DAT_015d346a == '\x01') {
      Output::Print(L"ERROR: DynamicProfileStorage: Unable to open file \'%s\' to import (%d)\n",
                    filename,(ulong)version);
      pcVar5 = strerror(version);
      MultiByteToWideChar(0,0,pcVar5,-1,(LPWSTR)&local_268,0x100);
      Output::Print(L"ERROR:   For file \'%s\': %s (%d)\n",filename,&local_268,(ulong)version);
      Output::Flush();
    }
  }
LAB_0097d2d1:
  bVar2 = false;
LAB_0097d2d4:
  DynamicProfileStorageReaderWriter::~DynamicProfileStorageReaderWriter
            ((DynamicProfileStorageReaderWriter *)(error_string + 0xfc));
  return bVar2;
}

Assistant:

bool DynamicProfileStorage::ImportFile(__in_z char16 const * filename, bool allowNonExistingFile)
{
    AssertOrFailFast(enabled);
    DynamicProfileStorageReaderWriter reader;
    errno_t e;
    if (!reader.Init(filename, _u("rb"), false, &e))
    {
        if (allowNonExistingFile)
        {
            return true;
        }
        else
        {
            if (Js::Configuration::Global.flags.Verbose)
            {
                Output::Print(_u("ERROR: DynamicProfileStorage: Unable to open file '%s' to import (%d)\n"), filename, e);

                char16 error_string[256];
                _wcserror_s(error_string, e);
                Output::Print(_u("ERROR:   For file '%s': %s (%d)\n"), filename, error_string, e);
                Output::Flush();
            }
            return false;
        }
    }

    DWORD magic;
    DWORD version;
    DWORD recordCount;
    if (!reader.Read(&magic)
        || !reader.Read(&version)
        || !reader.Read(&recordCount))
    {
        return false;
    }

    if (magic != MagicNumber)
    {
        Output::Print(_u("ERROR: DynamicProfileStorage: '%s' is not a dynamic profile data file"), filename);
        Output::Flush();
        return false;
    }
    if (version != FileFormatVersion)
    {
        if (allowNonExistingFile)
        {
            // Treat version mismatch as non-existent file
            return true;
        }
        Output::Print(_u("ERROR: DynamicProfileStorage: '%s' has format version %d; version %d expected"), filename,
            version, FileFormatVersion);
        Output::Flush();
        return false;
    }

    for (uint i = 0; i < recordCount; i++)
    {
        DWORD len;
        char16 * name;
        if (!reader.ReadUtf8String(&name, &len))
        {
            AssertOrFailFast(false);
            return false;
        }

        DWORD recordLen;
        if (!reader.Read(&recordLen))
        {
            AssertOrFailFast(false);
            return false;
        }

        char * record = AllocRecord(recordLen);
        if (record == nullptr)
        {
            Output::Print(_u("ERROR: DynamicProfileStorage: Out of memory importing '%s'\n"), filename);
            Output::Flush();
            NoCheckHeapDeleteArray(len + 1, name);
            return false;
        }

        if (!reader.ReadArray(GetRecordBuffer(record), recordLen))
        {
            NoCheckHeapDeleteArray(len + 1, name);
            DeleteRecord(record);
            AssertOrFailFast(false);
            return false;
        }

        SaveRecord(name, record);

        // Save record will make a copy of the name
        NoCheckHeapDeleteArray(len + 1, name);
    }
#if DBG_DUMP
    if (DynamicProfileStorage::DoTrace())
    {
        Output::Print(_u("TRACE: DynamicProfileStorage: Imported file: '%s'\n"), filename);
        Output::Flush();
    }
#endif
    AssertOrFailFastMsg(recordCount == (uint)infoMap.Count(), "failed to read all the records");
    return true;
}